

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamRandomAccessController::OpenIndex
          (BamRandomAccessController *this,string *indexFilename,BamReaderPrivate *reader)

{
  uint uVar1;
  undefined8 in_RSI;
  string message_1;
  string indexError;
  string message;
  BamIndex *index;
  BamIndex *in_stack_fffffffffffffe58;
  BamRandomAccessController *in_stack_fffffffffffffe60;
  allocator *paVar2;
  RuleToken *in_stack_fffffffffffffe68;
  RuleToken *__lhs;
  allocator local_171;
  string local_170 [32];
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  BamRandomAccessController *in_stack_fffffffffffffec0;
  string local_128 [24];
  BamReaderPrivate *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  BamIndex *local_28;
  undefined8 local_18;
  byte local_1;
  
  local_18 = in_RSI;
  local_28 = BamIndexFactory::CreateIndexFromFilename
                       (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (local_28 == (BamIndex *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"could not open index file: ",&local_69);
    std::operator+(in_stack_fffffffffffffe68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"BamRandomAccessController::OpenIndex",&local_a1);
    SetErrorString(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    local_1 = 0;
    std::__cxx11::string::~string(local_48);
  }
  else {
    uVar1 = (*local_28->_vptr_BamIndex[5])(local_28,local_18);
    if ((uVar1 & 1) == 0) {
      BamIndex::GetErrorString_abi_cxx11_(in_stack_fffffffffffffe58);
      __lhs = (RuleToken *)&stack0xfffffffffffffeb7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffeb8,"could not load index data from file: ",
                 (allocator *)__lhs);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe60);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffe60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
      paVar2 = &local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"BamRandomAccessController::OpenIndex",paVar2);
      SetErrorString(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      local_1 = 0;
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_c8);
    }
    else {
      SetIndex(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_1 = 1;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamRandomAccessController::OpenIndex(const std::string& indexFilename,
                                          BamReaderPrivate* reader)
{

    // attempt create new index of type based on filename
    BamIndex* index = BamIndexFactory::CreateIndexFromFilename(indexFilename, reader);
    if (index == 0) {
        const std::string message = std::string("could not open index file: ") + indexFilename;
        SetErrorString("BamRandomAccessController::OpenIndex", message);
        return false;
    }

    // attempt to load data from index file
    if (!index->Load(indexFilename)) {
        const std::string indexError = index->GetErrorString();
        const std::string message = std::string("could not load index data from file: ") +
                                    indexFilename + "\n\t" + indexError;
        SetErrorString("BamRandomAccessController::OpenIndex", message);
        return false;
    }

    // save new index & return success
    SetIndex(index);
    return true;
}